

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall cmGeneratorTarget::CheckLinkLibraries(cmGeneratorTarget *this)

{
  _Base_ptr *pp_Var1;
  cmLinkItem *pcVar2;
  bool bVar3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  cmLinkItem *item_1;
  cmLinkItem *pcVar8;
  int iVar9;
  string *config;
  string *config_00;
  cmLinkImplItem *item;
  undefined1 local_60 [32];
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  local_60._0_8_ = (string *)(local_60 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,"LINK_LIBRARIES_ONLY_TARGETS","");
  bVar3 = cmTarget::GetPropertyAsBool(this->Target,(string *)local_60);
  if ((string *)local_60._0_8_ != (string *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if (bVar3) {
    cmMakefile::GetGeneratorConfigs_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_60,this->Makefile,IncludeEmptyConfig);
    for (config_00 = (string *)local_60._0_8_; config_00 != (string *)local_60._8_8_;
        config_00 = config_00 + 1) {
      GetLinkInterfaceLibraries(this,config_00,this,Link);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
  }
  for (p_Var5 = (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    pp_Var1 = &p_Var5[2]._M_parent;
    p_Var6 = (_Base_ptr)pp_Var1;
    for (p_Var7 = p_Var5[2]._M_left; p_Var7 != (_Base_ptr)0x0;
        p_Var7 = (&p_Var7->_M_left)[*(cmGeneratorTarget **)(p_Var7 + 1) < this]) {
      if (*(cmGeneratorTarget **)(p_Var7 + 1) >= this) {
        p_Var6 = p_Var7;
      }
    }
    p_Var7 = (_Base_ptr)pp_Var1;
    if ((p_Var6 != (_Base_ptr)pp_Var1) &&
       (p_Var7 = p_Var6, this < *(cmGeneratorTarget **)(p_Var6 + 1))) {
      p_Var7 = (_Base_ptr)pp_Var1;
    }
    iVar9 = 5;
    if ((p_Var7 != (_Base_ptr)pp_Var1) && (*(char *)((long)&p_Var7[6]._M_parent + 1) == '\x01')) {
      pcVar2 = (cmLinkItem *)p_Var7[1]._M_left;
      for (pcVar8 = (cmLinkItem *)p_Var7[1]._M_parent; pcVar8 != pcVar2;
          pcVar8 = (cmLinkItem *)&pcVar8[1].String._M_string_length) {
        bVar4 = VerifyLinkItemColons(this,Implementation,pcVar8);
        iVar9 = 1;
        if ((!bVar4) ||
           ((bVar3 && (bVar4 = VerifyLinkItemIsTarget(this,Implementation,pcVar8), !bVar4))))
        goto LAB_004c0453;
      }
      iVar9 = 0;
    }
LAB_004c0453:
    if ((iVar9 != 5) && (iVar9 != 0)) {
      return;
    }
  }
  local_38 = (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_38 != local_40) {
    do {
      p_Var7 = local_38 + 2;
      for (p_Var5 = local_38[2]._M_right; p_Var5 != (_Rb_tree_node_base *)&p_Var7->_M_parent;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        iVar9 = 0xb;
        if (*(char *)((long)&p_Var5[8]._M_right + 2) == '\x01') {
          pcVar2 = (cmLinkItem *)p_Var5[1]._M_left;
          for (pcVar8 = (cmLinkItem *)p_Var5[1]._M_parent; pcVar8 != pcVar2; pcVar8 = pcVar8 + 1) {
            iVar9 = 1;
            bVar4 = VerifyLinkItemColons(this,Interface,pcVar8);
            if (!bVar4) goto LAB_004c0508;
            if (bVar3) {
              iVar9 = 1;
              bVar4 = VerifyLinkItemIsTarget(this,Interface,pcVar8);
              if (!bVar4) goto LAB_004c0508;
            }
          }
          iVar9 = 0;
        }
LAB_004c0508:
        if ((iVar9 != 0xb) && (iVar9 != 0)) goto LAB_004c052a;
      }
      iVar9 = 10;
LAB_004c052a:
    } while (((iVar9 == 10) || (iVar9 == 0)) &&
            (local_38 = (_Base_ptr)std::_Rb_tree_increment(local_38), local_38 != local_40));
  }
  return;
}

Assistant:

void cmGeneratorTarget::CheckLinkLibraries() const
{
  bool linkLibrariesOnlyTargets =
    this->GetPropertyAsBool("LINK_LIBRARIES_ONLY_TARGETS");

  // Evaluate the link interface of this target if needed for extra checks.
  if (linkLibrariesOnlyTargets) {
    std::vector<std::string> const& configs =
      this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
    for (std::string const& config : configs) {
      this->GetLinkInterfaceLibraries(config, this, LinkInterfaceFor::Link);
    }
  }

  // Check link the implementation for each generated configuration.
  for (auto const& hmp : this->LinkImplMap) {
    HeadToLinkImplementationMap const& hm = hmp.second;
    // There could be several entries used when computing the pre-CMP0022
    // default link interface.  Check only the entry for our own link impl.
    auto const hmi = hm.find(this);
    if (hmi == hm.end() || !hmi->second.LibrariesDone) {
      continue;
    }
    for (cmLinkImplItem const& item : hmi->second.Libraries) {
      if (!this->VerifyLinkItemColons(LinkItemRole::Implementation, item)) {
        return;
      }
      if (linkLibrariesOnlyTargets &&
          !this->VerifyLinkItemIsTarget(LinkItemRole::Implementation, item)) {
        return;
      }
    }
  }

  // Check link the interface for each generated combination of
  // configuration and consuming head target.  We should not need to
  // consider LinkInterfaceUsageRequirementsOnlyMap because its entries
  // should be a subset of LinkInterfaceMap (with LINK_ONLY left out).
  for (auto const& hmp : this->LinkInterfaceMap) {
    for (auto const& hmi : hmp.second) {
      if (!hmi.second.LibrariesDone) {
        continue;
      }
      for (cmLinkItem const& item : hmi.second.Libraries) {
        if (!this->VerifyLinkItemColons(LinkItemRole::Interface, item)) {
          return;
        }
        if (linkLibrariesOnlyTargets &&
            !this->VerifyLinkItemIsTarget(LinkItemRole::Interface, item)) {
          return;
        }
      }
    }
  }
}